

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandLutmin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerbose;
  int nLutSize;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_40 = 4;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Kvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          pAVar2 = Abc_NtkLutmin(pAVar2,local_40,local_44);
          if (pAVar2 == (Abc_Ntk_t *)0x0) {
            Abc_Print(-1,"The command has failed.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            pAbc_local._4_4_ = 0;
          }
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 != 0x4b) break;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_0022c878;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_44 = local_44 ^ 1;
  }
LAB_0022c878:
  Abc_Print(-2,"usage: lutmin [-K <num>] [-vh]\n");
  Abc_Print(-2,"\t           perform FPGA mapping while minimizing the LUT count\n");
  Abc_Print(-2,"\t           as described in the paper T. Sasao and A. Mishchenko:\n");
  Abc_Print(-2,"\t           \"On the number of LUTs to implement logic functions\".\n");
  Abc_Print(-2,"\t-K <num> : the LUT size to use for the mapping (2 <= num) [default = %d]\n",
            (ulong)local_40);
  pcVar3 = "no";
  if (local_44 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandLutmin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nLutSize;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nLutSize = 4;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_NtkLutmin( pNtk, nLutSize, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: lutmin [-K <num>] [-vh]\n" );
    Abc_Print( -2, "\t           perform FPGA mapping while minimizing the LUT count\n" );
    Abc_Print( -2, "\t           as described in the paper T. Sasao and A. Mishchenko:\n" );
    Abc_Print( -2, "\t           \"On the number of LUTs to implement logic functions\".\n" );
    Abc_Print( -2, "\t-K <num> : the LUT size to use for the mapping (2 <= num) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}